

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::span<char>_>::~alloca_destructor
          (alloca_destructor<libtorrent::span<char>_> *this)

{
  index_type iVar1;
  span<char> *psVar2;
  span<char> *o;
  span<char> *__end0;
  span<char> *__begin0;
  span<libtorrent::span<char>_> *__range4;
  alloca_destructor<libtorrent::span<char>_> *this_local;
  
  iVar1 = span<libtorrent::span<char>_>::size(&this->objects);
  if (iVar1 < 0x101) {
    __end0 = span<libtorrent::span<char>_>::begin(&this->objects);
    psVar2 = span<libtorrent::span<char>_>::end(&this->objects);
    for (; __end0 != psVar2; __end0 = __end0 + 1) {
    }
  }
  else {
    psVar2 = span<libtorrent::span<char>_>::data(&this->objects);
    if (psVar2 != (span<char> *)0x0) {
      operator_delete__(psVar2);
    }
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}